

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract_transaction.cpp
# Opt level: O3

void __thiscall
AbstractTransaction_CopyVariableBuffer_Test::TestBody
          (AbstractTransaction_CopyVariableBuffer_Test *this)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes;
  void *wally_tx_pointer;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  TestTransaction tx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  string test_data;
  AssertHelper local_98;
  internal local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  string local_78;
  TestTransaction local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  string local_30;
  
  TestTransaction::TestTransaction(&local_58);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"12345678","");
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90[0] = (internal)TestTransaction::CopyVariableBufferTest(&local_58,&local_30,&local_48);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_90[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,local_90,(AssertionResult *)"tx.CopyVariableBufferTest(test_data, &buffer)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x137,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if (local_98.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_98.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_98.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::StringUtil::ByteToString_abi_cxx11_((string *)&local_78,(StringUtil *)&local_48,bytes);
  testing::internal::CmpHelperSTREQ
            (local_90,"StringUtil::ByteToString(buffer).c_str()","\"0412345678\"",
             local_78._M_dataplus._M_p,"0412345678");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_88.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_88.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_abstract_transaction.cpp"
               ,0x138,message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_78._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
      }
    }
  }
  wally_tx_pointer = (void *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  local_58.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&PTR__AbstractTransaction_006915b0;
  cfd::core::AbstractTransaction::FreeWallyAddress
            ((AbstractTransaction *)local_58.super_AbstractTransaction.wally_tx_pointer_,
             wally_tx_pointer);
  return;
}

Assistant:

TEST(AbstractTransaction, CopyVariableBuffer) {
  TestTransaction tx;
  std::string test_data = "12345678";
  std::vector<uint8_t> buffer;
  EXPECT_TRUE(tx.CopyVariableBufferTest(test_data, &buffer));
  EXPECT_STREQ(StringUtil::ByteToString(buffer).c_str(), "0412345678");
}